

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v8::detail::
       parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  int iVar1;
  char *pcVar2;
  char *local_58;
  precision_adapter local_50;
  error_handler local_48 [40];
  
  local_58 = begin + 1;
  if (local_58 == end) {
LAB_00115686:
    pcVar2 = "missing precision specifier";
  }
  else {
    if ((int)*local_58 - 0x30U < 10) {
      iVar1 = parse_nonnegative_int<char>(&local_58,end,-1);
      if (iVar1 == -1) {
        pcVar2 = "number is too big";
        goto LAB_0011567c;
      }
      ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar1;
    }
    else {
      if (*local_58 != '{') goto LAB_00115686;
      pcVar2 = begin + 2;
      if (pcVar2 != end) {
        local_50.handler = handler;
        if ((*pcVar2 == ':') || (*pcVar2 == '}')) {
          specs_handler<char>::get_arg(local_48,&handler->super_specs_handler<char>);
          iVar1 = get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
                            ();
          ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar1;
        }
        else {
          pcVar2 = do_parse_arg_id<char,fmt::v8::detail::parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::precision_adapter&>
                             (pcVar2,end,&local_50);
        }
      }
      if ((pcVar2 == end) || (local_58 = pcVar2 + 1, *pcVar2 != '}')) {
        pcVar2 = "invalid format string";
        goto LAB_0011567c;
      }
    }
    if ((pointer_type < handler->arg_type_) || ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) == 0))
    {
      return local_58;
    }
    pcVar2 = "precision not allowed for this argument type";
  }
LAB_0011567c:
  error_handler::on_error(local_48,pcVar2);
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}